

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_buffer.c
# Opt level: O2

int lj_cf_buffer_method_ref(lua_State *L)

{
  TValue *pTVar1;
  uint64_t uVar2;
  SBufExt *pSVar3;
  void *pvVar4;
  
  pSVar3 = buffer_tobuf(L);
  if (*(long *)((L->glref).ptr64 + 0x180) == 0) {
    pTVar1 = L->top;
    uVar2 = (L->stack).ptr64;
    luaopen_ffi(L);
    L->top = (TValue *)((long)pTVar1 + ((L->stack).ptr64 - uVar2));
  }
  pvVar4 = lj_mem_newgco(L,0x18);
  *(undefined1 *)((long)pvVar4 + 9) = 10;
  *(undefined2 *)((long)pvVar4 + 10) = 0x14;
  *(char **)((long)pvVar4 + 0x10) = pSVar3->r;
  pTVar1 = L->top;
  L->top = pTVar1 + 1;
  pTVar1->u64 = (ulong)pvVar4 | 0xfffa800000000000;
  pTVar1 = L->top;
  L->top = pTVar1 + 1;
  pTVar1->n = (double)(*(int *)&pSVar3->w - *(int *)&pSVar3->r);
  return 2;
}

Assistant:

LJLIB_CF(buffer_method_ref)		LJLIB_REC(.)
{
  SBufExt *sbx = buffer_tobuf(L);
  GCcdata *cd;
  ctype_loadffi(L);
  cd = lj_cdata_new_(L, CTID_P_UINT8, CTSIZE_PTR);
  *(void **)cdataptr(cd) = sbx->r;
  setcdataV(L, L->top++, cd);
  setintV(L->top++, sbufxlen(sbx));
  return 2;
}